

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O1

void __thiscall
TPZDohrPrecond<long_double,_TPZDohrSubstructCondense<long_double>_>::MultAdd
          (TPZDohrPrecond<long_double,_TPZDohrSubstructCondense<long_double>_> *this,
          TPZFMatrix<long_double> *x,TPZFMatrix<long_double> *y,TPZFMatrix<long_double> *z,
          longdouble alpha,longdouble beta,int opt)

{
  double object;
  size_t sVar1;
  longdouble *plVar2;
  TPZDohrAssembleList<long_double> *this_00;
  TPZFMatrix<long_double> *local;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  list<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>_>_>
  *plVar7;
  int isub;
  long lVar8;
  long lVar9;
  _List_node_base *p_Var10;
  long lVar11;
  long lVar12;
  TPZAutoPointer<TPZDohrAssembleList<long_double>_> assemblelist;
  TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_> data;
  vector<std::thread,_std::allocator<std::thread>_> AllThreads;
  TPZDohrPrecondV2SubDataList<long_double,_TPZDohrSubstructCondense<long_double>_> v2work;
  TPZFMatrix<long_double> v2;
  TPZFMatrix<long_double> v1;
  TPZDohrPrecondThreadV1Data<long_double,_TPZDohrSubstructCondense<long_double>_> v1threaddata;
  TPZSimpleTimer precondi;
  TPZAutoPointer<TPZDohrAssembleList<long_double>_> local_280;
  _func_int **local_278;
  long local_270;
  __native_type *local_268;
  TPZAutoPointer<TPZFMatrix<long_double>_> local_260;
  TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_> local_258;
  TPZAutoPointer<TPZDohrAssembly<long_double>_> local_240;
  vector<std::thread,_std::allocator<std::thread>_> local_238;
  _List_node_base *local_220;
  __native_type local_218;
  _List_base<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>,_std::allocator<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>_>_>
  local_1f0;
  TPZAutoPointer<TPZDohrAssembleList<long_double>_> local_1d8 [2];
  TPZFMatrix<long_double> local_1c8;
  TPZFMatrix<long_double> local_138;
  undefined1 local_a8 [16];
  TPZFMatrix<long_double> *local_98;
  TPZSimpleTimer local_90;
  
  if (((opt == 0) &&
      ((this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol !=
       (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow)) ||
     ((this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow !=
      (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow)) {
    TPZMatrix<long_double>::Error("Operator* <matrices with incompatible dimensions>",(char *)0x0);
  }
  lVar11 = (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  if (((lVar11 != (y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol) ||
      (lVar11 != (z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol)) ||
     ((lVar11 = (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow,
      lVar11 != (y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow ||
      (lVar11 != (z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow)))) {
    TPZMatrix<long_double>::Error("TPZFMatrix::MultiplyAdd incompatible dimensions\n",(char *)0x0);
  }
  TPZSimpleTimer::TPZSimpleTimer(&local_90);
  lVar11 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  lVar4 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  TPZMatrix<long_double>::PrepareZ(&this->super_TPZMatrix<long_double>,y,z,beta,opt);
  lVar8 = (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  local_138.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_138.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_278 = (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_138.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_138.fElem = (longdouble *)0x0;
  local_138.fGiven = (longdouble *)0x0;
  local_138.fSize = 0;
  local_138.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = lVar11;
  local_138.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = lVar8;
  TPZVec<int>::TPZVec(&local_138.fPivot.super_TPZVec<int>,0);
  local_138.fPivot.super_TPZVec<int>.fStore = local_138.fPivot.fExtAlloc;
  local_138.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_138.fPivot.super_TPZVec<int>.fNElements = 0;
  local_138.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_138.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_138.fWork.fStore = (longdouble *)0x0;
  local_138.fWork.fNElements = 0;
  local_138.fWork.fNAlloc = 0;
  uVar6 = lVar8 * lVar11;
  if (uVar6 != 0) {
    uVar5 = 0xffffffffffffffff;
    if (uVar6 < 0x1000000000000000) {
      uVar5 = uVar6 * 0x10;
    }
    local_138.fElem = (longdouble *)operator_new__(uVar5);
    if (0 < (long)uVar6) {
      plVar2 = local_138.fElem;
      do {
        *plVar2 = (longdouble)0;
        plVar2 = plVar2 + 1;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
  }
  lVar8 = (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  local_1c8.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1c8.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1c8.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       local_278;
  local_1c8.fElem = (longdouble *)0x0;
  local_1c8.fGiven = (longdouble *)0x0;
  local_1c8.fSize = 0;
  local_1c8.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = lVar4;
  local_1c8.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = lVar8;
  TPZVec<int>::TPZVec(&local_1c8.fPivot.super_TPZVec<int>,0);
  local_1c8.fPivot.super_TPZVec<int>.fStore = local_1c8.fPivot.fExtAlloc;
  local_1c8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1c8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1c8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1c8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_1c8.fWork.fStore = (longdouble *)0x0;
  local_1c8.fWork.fNElements = 0;
  local_1c8.fWork.fNAlloc = 0;
  uVar6 = lVar8 * lVar4;
  if (uVar6 != 0) {
    uVar5 = 0xffffffffffffffff;
    if (uVar6 < 0x1000000000000000) {
      uVar5 = uVar6 * 0x10;
    }
    local_1c8.fElem = (longdouble *)operator_new__(uVar5);
    if (0 < (long)uVar6) {
      plVar2 = local_1c8.fElem;
      do {
        *plVar2 = (longdouble)0;
        plVar2 = plVar2 + 1;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
  }
  local_270 = lVar11;
  if (this->fNumThreads < 1) {
    ComputeV1(this,x,&local_138);
    ComputeV2(this,x,&local_1c8);
LAB_01479d2e:
    TPZFMatrix<long_double>::operator+=(&local_1c8,&local_138.super_TPZMatrix<long_double>);
    lVar11 = (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
    if (0 < lVar11) {
      lVar4 = 0;
      lVar8 = 0;
      do {
        if (0 < local_270) {
          lVar9 = 0;
          lVar12 = 0;
          do {
            if ((local_1c8.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow <= lVar12) ||
               (local_1c8.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol <= lVar8)) {
              TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if (((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow <= lVar12) ||
               ((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar8)) {
              TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar3 = (z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow * lVar4;
            *(longdouble *)((long)z->fElem + lVar9 + lVar3) =
                 *(longdouble *)
                  ((long)local_1c8.fElem +
                  lVar9 + local_1c8.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow * lVar4) +
                 *(longdouble *)((long)z->fElem + lVar9 + lVar3);
            lVar12 = lVar12 + 1;
            lVar9 = lVar9 + 0x10;
          } while (local_270 != lVar12);
        }
        lVar8 = lVar8 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar8 != lVar11);
    }
    object = TPZSimpleTimer::ReturnTimeDouble(&local_90);
    TPZStack<double,_10>::Push(&tempo.fPreCond,object);
    TPZFMatrix<long_double>::~TPZFMatrix(&local_1c8);
    TPZFMatrix<long_double>::~TPZFMatrix(&local_138);
    TPZSimpleTimer::~TPZSimpleTimer(&local_90);
    return;
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&local_238,(ulong)(uint)this->fNumThreads + 2,(allocator_type *)&local_218.__data);
  local_258.fSubStructure.fRef = (TPZReference *)local_a8;
  local_98 = &local_138;
  local_a8._0_8_ = this;
  local_a8._8_8_ = x;
  std::thread::
  thread<void*(&)(void*),TPZDohrPrecondThreadV1Data<long_double,TPZDohrSubstructCondense<long_double>>*,void>
            ((thread *)&local_218.__data,
             TPZDohrPrecondThreadV1Data<long_double,_TPZDohrSubstructCondense<long_double>_>::
             ComputeV1,
             (TPZDohrPrecondThreadV1Data<long_double,_TPZDohrSubstructCondense<long_double>_> **)
             &local_258);
  if (((local_238.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start)->_M_id)._M_thread == 0) {
    ((local_238.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start)->_M_id)._M_thread = local_218.__align;
    this_00 = (TPZDohrAssembleList<long_double> *)operator_new(0xe0);
    sVar1 = (this->fGlobal).
            super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>_>_>
            ._M_impl._M_node._M_size;
    local_240.fRef = (this->fAssemble).fRef;
    LOCK();
    ((local_240.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_240.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    TPZDohrAssembleList<long_double>::TPZDohrAssembleList(this_00,(int)sVar1,&local_1c8,&local_240);
    local_280.fRef = (TPZReference *)operator_new(0x10);
    plVar7 = &this->fGlobal;
    ((local_280.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
    (local_280.fRef)->fPointer = this_00;
    LOCK();
    ((local_280.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
    UNLOCK();
    TPZAutoPointer<TPZDohrAssembly<long_double>_>::~TPZAutoPointer(&local_240);
    local_1f0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_1f0;
    isub = 0;
    local_218.__data.__list.__next = (__pthread_internal_list *)0x0;
    local_218._16_8_ = 0;
    local_218.__data.__list.__prev = (__pthread_internal_list *)0x0;
    local_218.__align = 0;
    local_218._8_8_ = 0;
    local_1f0._M_impl._M_node._M_size = 0;
    local_1d8[0].fRef = local_280.fRef;
    LOCK();
    ((local_280.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_280.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    p_Var10 = (plVar7->
              super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>_>_>
              )._M_impl._M_node.super__List_node_base._M_next;
    local_220 = (_List_node_base *)plVar7;
    local_1f0._M_impl._M_node.super__List_node_base._M_prev =
         local_1f0._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var10 != (_List_node_base *)plVar7) {
      do {
        local = (TPZFMatrix<long_double> *)operator_new(0x90);
        (local->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = 0;
        (local->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = 0;
        (local->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
        (local->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = '\0';
        (local->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
             = local_278;
        local->fElem = (longdouble *)0x0;
        local->fGiven = (longdouble *)0x0;
        local->fSize = 0;
        TPZVec<int>::TPZVec(&(local->fPivot).super_TPZVec<int>,0);
        (local->fPivot).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
        (local->fPivot).super_TPZVec<int>.fStore = (local->fPivot).fExtAlloc;
        (local->fPivot).super_TPZVec<int>.fNElements = 0;
        (local->fPivot).super_TPZVec<int>.fNAlloc = 0;
        (local->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
        (local->fWork).fStore = (longdouble *)0x0;
        (local->fWork).fNElements = 0;
        (local->fWork).fNAlloc = 0;
        TPZDohrAssembly<long_double>::Extract(((this->fAssemble).fRef)->fPointer,isub,x,local);
        local_260.fRef = (TPZReference *)operator_new(0x10);
        ((local_260.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
        (local_260.fRef)->fPointer = local;
        LOCK();
        ((local_260.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
        UNLOCK();
        TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>::
        TPZDohrPrecondV2SubData
                  (&local_258,isub,
                   (TPZAutoPointer<TPZDohrSubstructCondense<long_double>_> *)(p_Var10 + 1),
                   &local_260);
        TPZAutoPointer<TPZFMatrix<long_double>_>::~TPZAutoPointer(&local_260);
        TPZDohrPrecondV2SubDataList<long_double,_TPZDohrSubstructCondense<long_double>_>::AddItem
                  ((TPZDohrPrecondV2SubDataList<long_double,_TPZDohrSubstructCondense<long_double>_>
                    *)&local_218.__data,&local_258);
        TPZAutoPointer<TPZDohrAssembleItem<long_double>_>::~TPZAutoPointer(&local_258.fv2_local);
        TPZAutoPointer<TPZFMatrix<long_double>_>::~TPZAutoPointer(&local_258.fInput_local);
        TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>::~TPZAutoPointer
                  (&local_258.fSubStructure);
        isub = isub + 1;
        p_Var10 = p_Var10->_M_next;
      } while (p_Var10 != local_220);
    }
    if (0 < this->fNumThreads) {
      lVar11 = 0;
      do {
        local_268 = &local_218;
        std::thread::
        thread<void*(&)(void*),TPZDohrPrecondV2SubDataList<long_double,TPZDohrSubstructCondense<long_double>>*,void>
                  ((thread *)&local_258,
                   TPZDohrPrecondV2SubDataList<long_double,_TPZDohrSubstructCondense<long_double>_>
                   ::ThreadWork,
                   (TPZDohrPrecondV2SubDataList<long_double,_TPZDohrSubstructCondense<long_double>_>
                    **)&local_268);
        if (local_238.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start[lVar11 + 2]._M_id._M_thread != 0) goto LAB_01479e84;
        local_238.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start[lVar11 + 2]._M_id._M_thread =
             (native_handle_type)local_258.fSubStructure.fRef;
        lVar11 = lVar11 + 1;
      } while (lVar11 < this->fNumThreads);
    }
    local_268 = (__native_type *)(local_280.fRef)->fPointer;
    std::thread::thread<void*(&)(void*),TPZDohrAssembleList<long_double>*,void>
              ((thread *)&local_258,TPZDohrAssembleList<long_double>::Assemble,
               (TPZDohrAssembleList<long_double> **)&local_268);
    if (local_238.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start[1]._M_id._M_thread == 0) {
      local_238.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start[1]._M_id._M_thread =
           (native_handle_type)local_258.fSubStructure.fRef;
      if (-2 < this->fNumThreads) {
        lVar11 = -1;
        do {
          std::thread::join();
          lVar11 = lVar11 + 1;
        } while (lVar11 <= this->fNumThreads);
      }
      TPZAutoPointer<TPZDohrAssembleList<long_double>_>::~TPZAutoPointer(local_1d8);
      std::__cxx11::
      _List_base<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>,_std::allocator<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>_>_>
      ::_M_clear(&local_1f0);
      TPZAutoPointer<TPZDohrAssembleList<long_double>_>::~TPZAutoPointer(&local_280);
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_238);
      goto LAB_01479d2e;
    }
  }
LAB_01479e84:
  std::terminate();
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {
    
#ifdef USING_TBB
	MultAddTBB(x, y, z, alpha, beta, opt);
	return;
#endif
    
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		this->Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		this->Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	TPZSimpleTimer precondi; // init of timer
	int64_t rows = this->Rows();
	int64_t cols = this->Cols();
	int64_t c;
	this->PrepareZ(y,z,beta,opt);
#ifdef PZ_LOG
	{
		std::stringstream sout;
		x.Print("x entry vector",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
		if (loggerv1v2.isDebugEnabled())
		{
			LOGPZ_DEBUG(loggerv1v2, sout.str())
		}
	}
#endif
	TPZFMatrix<TVar> v1(rows,x.Cols(),0.);
	TPZFMatrix<TVar> v2(cols,x.Cols(),0.);
	if(fNumThreads <= 0)
	{
		ComputeV1(x,v1);
		ComputeV2(x,v2);
	}
	else
	{
        std::vector<std::thread> AllThreads(fNumThreads+2);
		TPZDohrPrecondThreadV1Data<TVar,TSubStruct> v1threaddata(this,x,v1);
		
        AllThreads[0] = thread((TPZDohrPrecondThreadV1Data<TVar,TSubStruct>::ComputeV1), &v1threaddata);
		
		TPZAutoPointer<TPZDohrAssembleList<TVar> > assemblelist = new TPZDohrAssembleList<TVar>(fGlobal.size(),v2,this->fAssemble);
		
		TPZDohrPrecondV2SubDataList<TVar,TSubStruct> v2work(assemblelist);
		typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator it;
		
		int isub=0;
		//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
		for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
		{
			TPZFMatrix<TVar> *Residual_local = new TPZFMatrix<TVar>;
			fAssemble->Extract(isub,x,*Residual_local);
			TPZDohrPrecondV2SubData<TVar,TSubStruct> data(isub,*it,Residual_local);
			v2work.AddItem(data);
		}
		
		int i;
		for (i=0; i<fNumThreads; i++) {
            AllThreads[i+2] = std::thread(TPZDohrPrecondV2SubDataList<TVar,TSubStruct>::ThreadWork, &v2work);
		}
		//		v2work.ThreadWork(&v2work);
		AllThreads[1] = thread(TPZDohrAssembleList<TVar>::Assemble,
                               assemblelist.operator->());
		
		for (i=0; i<fNumThreads+2; i++) {
            AllThreads[i].join();
		}
		//		ComputeV2(x,v2);
	}
	v2 += v1;
	
#ifndef MAKEINTERNAL
	isub=0;
	//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
	{
		TPZFNMatrix<100> v2Expand((*it)->fNEquations,1,0.), v3Expand((*it)->fNEquations,1,0.);
		int64_t neqs = (*it)->fGlobalEqs.NElements();
		TPZFMatrix<TVar> v3_local(neqs,1,0.), v2_local(neqs,1,0.);
		fAssemble->Extract(isub,v2,v2_local);
		int64_t i;
		for (i=0;i<neqs;i++)
		{
			std::pair<int,int> ind = (*it)->fGlobalEqs[i];
			v2Expand(ind.first,0) += v2_local(i,0);
		}
		
		(*it)->Contribute_v3_local(v2Expand,v3Expand);
		for (i=0;i<neqs;i++)
		{
			std::pair<int,int> ind = (*it)->fGlobalEqs[i];
			v3_local(i,0) += v3Expand(ind.first,0);
		}
#ifdef PZ_LOG
		{
			std::stringstream sout;
			v2Expand.Print("v1+v2 Expand",sout);
			v3Expand.Print("v3 Expand", sout);
			v2_local.Print("v1+v2 local",sout);
			v3_local.Print("v3 local",sout);
			if (logger.isDebugEnabled())
			{
				LOGPZ_DEBUG(logger, sout.str());
			}
		}
#endif
		fAssemble->Assemble(isub,v3_local,v2);
	}
#endif
	// wait task para finalizacao da chamada
	// esperar a versao correta do v1
	/* Sum v1+v2+v3 with z */
    int64_t xcols = x.Cols();
    for (int64_t ic=0; ic<xcols; ic++)
    {
        for (c=0; c<rows; c++) {
            z(c,ic) += v2(c,ic);
        }
    }
	tempo.fPreCond.Push(precondi.ReturnTimeDouble()); // end of timer
}